

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

bool __thiscall
BlurayHelper::writeBluRayFiles
          (BlurayHelper *this,MuxerManager *muxer,bool usedBlankPL,int mplsNum,int blankNum,
          bool stereoMode)

{
  AbstractMuxer *__last;
  byte bVar1;
  byte bVar2;
  DiskType DVar3;
  pointer paVar4;
  AbstractMuxer *pAVar5;
  bool bVar6;
  byte bVar7;
  uint16_t uVar8;
  int i;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  long lVar13;
  _func_int **pp_Var14;
  pointer pMVar15;
  ulong uVar16;
  pointer pMVar17;
  const_iterator __end1;
  File *pFVar18;
  AbstractMuxer *__first;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  *__range2;
  MuxerManager *pMVar19;
  char cVar20;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  *navCmds;
  undefined8 uVar21;
  initializer_list<std::array<unsigned_char,_12UL>_> __l;
  initializer_list<std::array<unsigned_char,_12UL>_> __l_00;
  initializer_list<std::array<unsigned_char,_12UL>_> __l_01;
  uint16_t local_1ea;
  File *local_1e8;
  allocator_type local_1dd;
  SubTrackMode mode;
  MuxerManager *local_1d8;
  MuxerManager *local_1d0;
  vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
  movieObjects;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> objectData;
  undefined2 local_120;
  undefined1 local_11e [6];
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_118;
  undefined2 local_100;
  undefined1 local_fe;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_f8;
  undefined2 local_e0;
  undefined1 local_de;
  string prefix;
  array<unsigned_char,_4UL> type_indicator;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  array<unsigned_char,_4UL> version_number;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  
  local_1d8 = (MuxerManager *)CONCAT44(local_1d8._4_4_,blankNum);
  local_1d0 = muxer;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    std::__cxx11::string::string((string *)&prefix,(string *)&this->m_dstPath);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"",(allocator<char> *)local_1a8);
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    local_1e8 = (File *)operator_new(0x38);
    File::File(local_1e8);
  }
  else {
    local_1e8 = (File *)IsoWriter::createFile(this->m_isoWriter);
  }
  if (this->m_dt == BLURAY) {
    bVar6 = isV3();
    if (bVar6) {
      bdIndexData[5] = '3';
      bdIndexData[0xf] = 'x';
      for (lVar13 = 0; lVar13 != 0x24; lVar13 = lVar13 + 1) {
        bdIndexData[lVar13 + 0x78] = ""[lVar13];
      }
      bVar6 = is4K();
      if (bVar6) {
        bdIndexData[0x94] = 'Q';
      }
      bdIndexData[0x96] = 1;
      if ((V3_flags & 0x1eU) != 0) {
        bdIndexData[0x96] = (byte)V3_flags & 0x1e;
      }
      uVar21 = 0x9c;
    }
    else {
      bdIndexData[5] = '2';
      uVar21 = 0x78;
    }
  }
  else {
    bdIndexData[5] = '1';
    bdIndexData[0xf] = 'x';
    uVar21 = 0x210;
  }
  bdIndexData[0x2c] = '`';
  if (!stereoMode) {
    bdIndexData[0x2c] = '\0';
  }
  std::operator+(local_1a8,&prefix,"BDMV/index.bdmv");
  pFVar18 = local_1e8;
  iVar9 = (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                    (local_1e8,
                     CONCAT17(local_1a8[0]._M_dataplus._M_p._7_1_,
                              CONCAT16(local_1a8[0]._M_dataplus._M_p._6_1_,
                                       CONCAT15(local_1a8[0]._M_dataplus._M_p._5_1_,
                                                CONCAT14(local_1a8[0]._M_dataplus._M_p._4_1_,
                                                         CONCAT22(local_1a8[0]._M_dataplus._M_p.
                                                                  _2_2_,CONCAT11(local_1a8[0].
                                                                                 _M_dataplus._M_p.
                                                                                 _1_1_,local_1a8[0].
                                                                                       _M_dataplus.
                                                                                       _M_p._0_1_)))
                                               ))),2);
  std::__cxx11::string::~string((string *)local_1a8);
  pp_Var14 = (pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream;
  if ((char)iVar9 != '\0') {
    (*pp_Var14[5])(pFVar18,bdIndexData,uVar21);
    (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
    std::operator+(local_1a8,&prefix,"BDMV/BACKUP/index.bdmv");
    pFVar18 = local_1e8;
    iVar9 = (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                      (local_1e8,
                       CONCAT17(local_1a8[0]._M_dataplus._M_p._7_1_,
                                CONCAT16(local_1a8[0]._M_dataplus._M_p._6_1_,
                                         CONCAT15(local_1a8[0]._M_dataplus._M_p._5_1_,
                                                  CONCAT14(local_1a8[0]._M_dataplus._M_p._4_1_,
                                                           CONCAT22(local_1a8[0]._M_dataplus._M_p.
                                                                    _2_2_,CONCAT11(local_1a8[0].
                                                                                   _M_dataplus._M_p.
                                                                                   _1_1_,local_1a8[0
                                                  ]._M_dataplus._M_p._0_1_)))))),2);
    std::__cxx11::string::~string((string *)local_1a8);
    pp_Var14 = (pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream;
    if ((char)iVar9 != '\0') {
      (*pp_Var14[5])(pFVar18,bdIndexData,uVar21);
      (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
      DVar3 = this->m_dt;
      type_indicator._M_elems[0] = 'P';
      type_indicator._M_elems[1] = '\0';
      type_indicator._M_elems[2] = '\0';
      type_indicator._M_elems[3] = '\x01';
      uStack_b4 = '\0';
      uStack_b3 = '\0';
      uStack_b2 = '\0';
      uStack_b1 = '\n';
      if (usedBlankPL) {
        my_ntohl((uint32_t)local_1d8);
      }
      my_ntohl(mplsNum);
      __l._M_len = 5;
      __l._M_array = (iterator)&type_indicator;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
              *)&objectData,__l,(allocator_type *)&mode);
      local_120 = 1;
      local_11e[0] = 0;
      memcpy(local_1a8,&DAT_00203a34,0x6c);
      __l_00._M_len = 9;
      __l_00._M_array = (iterator)local_1a8;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
              *)(local_11e + 6),__l_00,(allocator_type *)&local_1ea);
      local_100 = 1;
      local_fe = 0;
      version_number._M_elems[0] = 'P';
      version_number._M_elems[1] = '@';
      version_number._M_elems[2] = '\0';
      version_number._M_elems[3] = '\x01';
      uStack_74 = '\0';
      uStack_73 = '\0';
      uStack_72 = '\0';
      uStack_71 = '\0';
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)&version_number;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector(&local_f8,__l_01,&local_1dd);
      local_e0 = 1;
      local_de = 0;
      movieObjects.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      movieObjects.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      movieObjects.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pMVar15 = (pointer)operator_new(0x60);
      movieObjects.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar15 + 3;
      movieObjects.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar15;
      for (lVar13 = 0;
          pMVar17 = (pointer)((long)&(pMVar15->navigationCommands).
                                     super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13),
          lVar13 != 0x60; lVar13 = lVar13 + 0x20) {
        std::
        vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
        vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)pMVar17,
               (vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)((long)&objectData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar13));
        (&pMVar15->titleSearchMask)[lVar13] = (bool)local_11e[lVar13];
        *(undefined2 *)(&pMVar15->resumeIntentionFlag + lVar13) =
             *(undefined2 *)(local_11e + lVar13 + -2);
      }
      lVar13 = 0x40;
      movieObjects.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar17;
      do {
        std::
        _Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                         *)((long)&objectData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar13));
        pMVar19 = local_1d0;
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != -0x20);
      cVar20 = '\0';
      if (DVar3 == BLURAY) {
        bVar6 = isV3();
        cVar20 = bVar6 + '\x01';
      }
      uVar10 = MuxerManager::getDefaultAudioTrackIdx(pMVar19);
      uVar11 = MuxerManager::getDefaultSubTrackIdx(pMVar19,&mode);
      pMVar19 = (MuxerManager *)
                movieObjects.
                super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar11 & uVar10) != 0xffffffff) {
        paVar4 = ((movieObjects.
                   super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
                   ._M_impl.super__Vector_impl_data._M_start)->navigationCommands).
                 super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1a8[0]._M_string_length._0_2_ = 0;
        local_1a8[0]._M_string_length._2_2_ = 0;
        local_1a8[0]._M_dataplus._M_p._0_1_ = 0x51;
        local_1a8[0]._M_dataplus._M_p._1_1_ = 0xc0;
        local_1a8[0]._M_dataplus._M_p._2_2_ = 0x100;
        local_1a8[0]._M_dataplus._M_p._4_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._5_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._6_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._7_1_ = 0;
        if (-1 < (int)uVar10) {
          uVar8 = my_ntohs((short)uVar10 + 1);
          local_1a8[0]._M_dataplus._M_p._5_1_ = (undefined1)(uVar8 >> 8);
          local_1a8[0]._M_dataplus._M_p._4_1_ = (byte)uVar8 & 0xf | 0x80;
        }
        local_1a8[0]._M_dataplus._M_p._7_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._6_1_ = 0;
        if ((int)uVar11 < 0) {
          bVar7 = 0x40;
        }
        else {
          uVar8 = my_ntohs((short)uVar11 + 1);
          local_1a8[0]._M_dataplus._M_p._7_1_ = (undefined1)(uVar8 >> 8);
          local_1a8[0]._M_string_length._0_2_ = 0;
          bVar7 = (byte)uVar8 & 0xf;
          local_1a8[0]._M_dataplus._M_p._6_1_ = bVar7 + 0x80;
          bVar7 = bVar7 | 0xc0;
        }
        if (mode == All) {
          local_1a8[0]._M_dataplus._M_p._6_1_ = bVar7;
        }
        objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT17(local_1a8[0]._M_dataplus._M_p._7_1_,
                               CONCAT16(local_1a8[0]._M_dataplus._M_p._6_1_,
                                        CONCAT15(local_1a8[0]._M_dataplus._M_p._5_1_,
                                                 CONCAT14(local_1a8[0]._M_dataplus._M_p._4_1_,
                                                          CONCAT22(local_1a8[0]._M_dataplus._M_p.
                                                                   _2_2_,CONCAT11(local_1a8[0].
                                                                                  _M_dataplus._M_p.
                                                                                  _1_1_,local_1a8[0]
                                                                                        ._M_dataplus
                                                                                        ._M_p._0_1_)
                                                                  )))));
        objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(objectData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               CONCAT22(local_1a8[0]._M_string_length._2_2_,
                                        (undefined2)local_1a8[0]._M_string_length));
        std::
        vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
        _M_insert_rval((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                        *)pMVar19,paVar4 + 2,(value_type *)&objectData);
      }
      pMVar15 = movieObjects.
                super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      builtin_memcpy(type_indicator._M_elems,"MOBJ",4);
      uVar10 = 0x30303230;
      if (cVar20 != '\x01') {
        uVar10 = (uint)(cVar20 == '\x02') << 9 | 0x30303130;
      }
      version_number._M_elems[0] = (char)uVar10;
      version_number._M_elems[1] = (char)(uVar10 >> 8);
      version_number._M_elems[2] = (char)(uVar10 >> 0x10);
      version_number._M_elems[3] = (char)(uVar10 >> 0x18);
      objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar10 = 6;
      for (pMVar17 = (pointer)pMVar19;
          pMVar17 !=
          movieObjects.
          super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
          ._M_impl.super__Vector_impl_data._M_finish; pMVar17 = pMVar17 + 1) {
        uVar10 = uVar10 + ((uint)(((long)(pMVar17->navigationCommands).
                                         super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pMVar17->navigationCommands).
                                        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) & 0xffff)
                          * 0xc + 4;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&objectData,(ulong)uVar10 + 0x2c);
      (anonymous_namespace)::push_back_raw<std::array<unsigned_char,4ul>>
                (&objectData,&type_indicator);
      (anonymous_namespace)::push_back_raw<std::array<unsigned_char,4ul>>
                (&objectData,&version_number);
      uVar12 = my_ntohl(0);
      local_1a8[0]._M_dataplus._M_p._0_1_ = (undefined1)uVar12;
      local_1a8[0]._M_dataplus._M_p._1_1_ = (undefined1)(uVar12 >> 8);
      local_1a8[0]._M_dataplus._M_p._2_2_ = (undefined2)(uVar12 >> 0x10);
      anon_unknown.dwarf_3adab::push_back_raw<unsigned_int>(&objectData,(uint *)local_1a8);
      local_1a8[0]._M_dataplus._M_p._0_1_ = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&objectData,
                 (size_type)
                 (objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish +
                 (0x1c - (long)objectData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)),
                 (value_type_conflict1 *)local_1a8);
      uVar12 = my_ntohl(uVar10);
      local_1a8[0]._M_dataplus._M_p._0_1_ = (undefined1)uVar12;
      local_1a8[0]._M_dataplus._M_p._1_1_ = (undefined1)(uVar12 >> 8);
      local_1a8[0]._M_dataplus._M_p._2_2_ = (undefined2)(uVar12 >> 0x10);
      anon_unknown.dwarf_3adab::push_back_raw<unsigned_int>(&objectData,(uint *)local_1a8);
      uVar12 = my_ntohl(0);
      local_1a8[0]._M_dataplus._M_p._0_1_ = (undefined1)uVar12;
      local_1a8[0]._M_dataplus._M_p._1_1_ = (undefined1)(uVar12 >> 8);
      local_1a8[0]._M_dataplus._M_p._2_2_ = (undefined2)(uVar12 >> 0x10);
      anon_unknown.dwarf_3adab::push_back_raw<unsigned_int>(&objectData,(uint *)local_1a8);
      uVar8 = my_ntohs((uint16_t)((uint)((int)pMVar15 - (int)pMVar19) >> 5));
      local_1a8[0]._M_dataplus._M_p._0_1_ = (undefined1)uVar8;
      local_1a8[0]._M_dataplus._M_p._1_1_ = (undefined1)(uVar8 >> 8);
      anon_unknown.dwarf_3adab::push_back_raw<unsigned_short>
                (&objectData,(unsigned_short *)local_1a8);
      local_1d8 = (MuxerManager *)pMVar15;
      for (; pMVar19 != local_1d8;
          pMVar19 = (MuxerManager *)&(pMVar19->m_outFileName)._M_string_length) {
        bVar7 = *(byte *)&(pMVar19->m_outFileName)._M_dataplus._M_p;
        bVar1 = *(byte *)((long)&(pMVar19->m_outFileName)._M_dataplus._M_p + 1);
        bVar2 = *(byte *)((long)&(pMVar19->m_outFileName)._M_dataplus._M_p + 2);
        uVar16 = (long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&pMVar19->m_subMuxer)->_M_allocated_capacity -
                       (long)pMVar19->m_mainMuxer) / 0xc;
        local_1a8[0]._M_dataplus._M_p._0_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._1_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._2_2_ = 0;
        local_1a8[0]._M_dataplus._M_p._4_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._5_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._6_1_ = 0;
        local_1a8[0]._M_dataplus._M_p._7_1_ = 0;
        local_1a8[0]._M_string_length._0_2_ = 0;
        local_1a8[0]._M_string_length._2_2_ = 0;
        local_1a8[0]._M_string_length._4_4_ = 0;
        local_1a8[0].field_2._M_allocated_capacity = 0;
        local_1d0 = pMVar19;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,
                   (uVar16 & 0xffff) * 0xc + 4);
        local_1ea = my_ntohs((ushort)bVar2 << 0xd | (ushort)bVar1 << 0xe | (ushort)bVar7 << 0xf);
        anon_unknown.dwarf_3adab::push_back_raw<unsigned_short>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_1ea);
        local_1ea = my_ntohs((uint16_t)uVar16);
        pMVar19 = local_1d0;
        anon_unknown.dwarf_3adab::push_back_raw<unsigned_short>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_1ea);
        pAVar5 = pMVar19->m_subMuxer;
        __first = pMVar19->m_mainMuxer;
        while (__first != pAVar5) {
          __last = (AbstractMuxer *)((long)&__first->m_owner + 4);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((uchar *)__first,(uchar *)__last,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
          __first = __last;
        }
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)CONCAT17(local_1a8[0]._M_dataplus._M_p._7_1_,
                                     CONCAT16(local_1a8[0]._M_dataplus._M_p._6_1_,
                                              CONCAT15(local_1a8[0]._M_dataplus._M_p._5_1_,
                                                       CONCAT14(local_1a8[0]._M_dataplus._M_p._4_1_,
                                                                CONCAT22(local_1a8[0]._M_dataplus.
                                                                         _M_p._2_2_,
                                                                         CONCAT11(local_1a8[0].
                                                                                  _M_dataplus._M_p.
                                                                                  _1_1_,local_1a8[0]
                                                                                        ._M_dataplus
                                                                                        ._M_p._0_1_)
                                                                        ))))),
                   (uchar *)CONCAT44(local_1a8[0]._M_string_length._4_4_,
                                     CONCAT22(local_1a8[0]._M_string_length._2_2_,
                                              (undefined2)local_1a8[0]._M_string_length)),
                   &objectData);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
      }
      std::operator+(local_1a8,&prefix,"BDMV/MovieObject.bdmv");
      pFVar18 = local_1e8;
      iVar9 = (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2]
              )(local_1e8,
                CONCAT17(local_1a8[0]._M_dataplus._M_p._7_1_,
                         CONCAT16(local_1a8[0]._M_dataplus._M_p._6_1_,
                                  CONCAT15(local_1a8[0]._M_dataplus._M_p._5_1_,
                                           CONCAT14(local_1a8[0]._M_dataplus._M_p._4_1_,
                                                    CONCAT22(local_1a8[0]._M_dataplus._M_p._2_2_,
                                                             CONCAT11(local_1a8[0]._M_dataplus._M_p.
                                                                      _1_1_,local_1a8[0]._M_dataplus
                                                                            ._M_p._0_1_)))))),2,0);
      std::__cxx11::string::~string((string *)local_1a8);
      if ((char)iVar9 == '\0') {
LAB_0018f024:
        bVar6 = false;
      }
      else {
        (*(pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                  (pFVar18,objectData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (ulong)(uint)((int)objectData.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)objectData.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        (*(pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])
                  (pFVar18);
        std::operator+(local_1a8,&prefix,"BDMV/BACKUP/MovieObject.bdmv");
        iVar9 = (*(pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2]
                )(pFVar18,CONCAT17(local_1a8[0]._M_dataplus._M_p._7_1_,
                                   CONCAT16(local_1a8[0]._M_dataplus._M_p._6_1_,
                                            CONCAT15(local_1a8[0]._M_dataplus._M_p._5_1_,
                                                     CONCAT14(local_1a8[0]._M_dataplus._M_p._4_1_,
                                                              CONCAT22(local_1a8[0]._M_dataplus._M_p
                                                                       ._2_2_,CONCAT11(local_1a8[0].
                                                                                       _M_dataplus.
                                                                                       _M_p._1_1_,
                                                                                       local_1a8[0].
                                                                                       _M_dataplus.
                                                                                       _M_p._0_1_)))
                                                    ))),2,0);
        std::__cxx11::string::~string((string *)local_1a8);
        if ((char)iVar9 == '\0') goto LAB_0018f024;
        (*(pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                  (pFVar18,objectData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (ulong)(uint)((int)objectData.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)objectData.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        bVar6 = true;
        (*(pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])
                  (pFVar18);
      }
      (*(pFVar18->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[1])(pFVar18)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&objectData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::
      vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ::~vector(&movieObjects);
      goto LAB_0018f046;
    }
  }
  (*pp_Var14[1])(pFVar18);
  bVar6 = false;
LAB_0018f046:
  std::__cxx11::string::~string((string *)&prefix);
  return bVar6;
}

Assistant:

bool BlurayHelper::writeBluRayFiles(const MuxerManager& muxer, const bool usedBlankPL, const int mplsNum,
                                    const int blankNum, const bool stereoMode) const
{
    int fileSize = sizeof(bdIndexData);
    const string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    if (m_dt == DiskType::BLURAY)
    {
        if (isV3())
        {
            bdIndexData[5] = '3';
            fileSize = 0x9C;         // add 36 bytes for UHD data extension
            bdIndexData[15] = 0x78;  // start address of UHD data extension

            // UHD data extension
            uint8_t* V3metaData = bdIndexData + 0x78;
            static constexpr char metaData[37] =
                "\x00\x00\x00\x20\x00\x00\x00\x18\x00\x00\x00\x01"
                "\x00\x03\x00\x01\x00\x00\x00\x18\x00\x00\x00\x0C"
                "\x00\x00\x00\x08\x20\x00\x00\x00\x00\x00\x00\x00";
            for (int i = 0; i < 36; i++) V3metaData[i] = metaData[i];

            // 4K => 66/100 GB Disk, 109 MB/s Recording_Rate
            if (is4K())
                bdIndexData[0x94] = 0x51;
            // include HDR flags
            bdIndexData[0x96] = (V3_flags & 0x1e);
            // no HDR10 detected => SDR flag
            if (bdIndexData[0x96] == 0)
                bdIndexData[0x96] = 1;
        }
        else  // V2 Blu-ray
        {
            bdIndexData[5] = '2';
            fileSize = 0x78;
        }
    }
    else
    {
        bdIndexData[5] = '1';
        bdIndexData[15] = 0x78;
    }
    bdIndexData[0x2c] = stereoMode ? 0x60 : 0;  // set initial_output_mode_preference and SS_content_exist_flag

    if (!file->open((prefix + "BDMV/index.bdmv").c_str(), AbstractOutputStream::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    if (!file->open((prefix + "BDMV/BACKUP/index.bdmv").c_str(), File::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    return writeBdMovieObjectData(muxer, file, prefix, m_dt, usedBlankPL, mplsNum, blankNum);
}